

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationDeviceImpl.cpp
# Opt level: O1

void __thiscall
Diligent::SerializationDeviceImpl::GetPipelineResourceBindings
          (SerializationDeviceImpl *this,PipelineResourceBindingAttribs *Info,Uint32 *NumBindings,
          PipelineResourceBinding **pBindings)

{
  pointer pPVar1;
  PipelineResourceBinding *pPVar2;
  
  *NumBindings = 0;
  *pBindings = (PipelineResourceBinding *)0x0;
  pPVar1 = (this->m_ResourceBindings).
           super__Vector_base<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_ResourceBindings).
      super__Vector_base<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
      ._M_impl.super__Vector_impl_data._M_finish != pPVar1) {
    (this->m_ResourceBindings).
    super__Vector_base<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
    ._M_impl.super__Vector_impl_data._M_finish = pPVar1;
  }
  if (Info->DeviceType - RENDER_DEVICE_TYPE_GL < 2) {
    GetPipelineResourceBindingsGL(Info,&this->m_ResourceBindings);
  }
  else {
    if (Info->DeviceType != RENDER_DEVICE_TYPE_VULKAN) {
      return;
    }
    GetPipelineResourceBindingsVk(Info,&this->m_ResourceBindings);
  }
  pPVar2 = (this->m_ResourceBindings).
           super__Vector_base<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *NumBindings = (Uint32)((ulong)((long)(this->m_ResourceBindings).
                                        super__Vector_base<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2)
                         >> 5);
  *pBindings = pPVar2;
  return;
}

Assistant:

void SerializationDeviceImpl::GetPipelineResourceBindings(const PipelineResourceBindingAttribs& Info,
                                                          Uint32&                               NumBindings,
                                                          const PipelineResourceBinding*&       pBindings)
{
    NumBindings = 0;
    pBindings   = nullptr;
    m_ResourceBindings.clear();

    switch (Info.DeviceType)
    {
#if D3D11_SUPPORTED
        case RENDER_DEVICE_TYPE_D3D11:
            GetPipelineResourceBindingsD3D11(Info, m_ResourceBindings);
            break;
#endif
#if D3D12_SUPPORTED
        case RENDER_DEVICE_TYPE_D3D12:
            GetPipelineResourceBindingsD3D12(Info, m_ResourceBindings);
            break;
#endif
#if GL_SUPPORTED || GLES_SUPPORTED
        case RENDER_DEVICE_TYPE_GL:
        case RENDER_DEVICE_TYPE_GLES:
            GetPipelineResourceBindingsGL(Info, m_ResourceBindings);
            break;
#endif
#if VULKAN_SUPPORTED
        case RENDER_DEVICE_TYPE_VULKAN:
            GetPipelineResourceBindingsVk(Info, m_ResourceBindings);
            break;
#endif
#if METAL_SUPPORTED
        case RENDER_DEVICE_TYPE_METAL:
            GetPipelineResourceBindingsMtl(Info, m_ResourceBindings, m_MtlProps.MaxBufferFunctionArgumets);
            break;
#endif
        case RENDER_DEVICE_TYPE_UNDEFINED:
        case RENDER_DEVICE_TYPE_COUNT:
        default:
            return;
    }

    NumBindings = static_cast<Uint32>(m_ResourceBindings.size());
    pBindings   = m_ResourceBindings.data();
}